

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.hpp
# Opt level: O0

void __thiscall Lista<int>::Lista(Lista<int> *this,Lista<int> *l)

{
  undefined1 local_28 [8];
  Lista<int> nueva;
  Lista<int> *l_local;
  Lista<int> *this_local;
  
  nueva._ult = (Nodo *)l;
  Lista(this);
  Lista((Lista<int> *)local_28);
  operator=((Lista<int> *)local_28,(Lista<int> *)nueva._ult);
  operator=(this,(Lista<int> *)local_28);
  ~Lista((Lista<int> *)local_28);
  return;
}

Assistant:

Lista<T>::Lista(const Lista<T>& l) : Lista() {
    Lista nueva = Lista();
    nueva = l;
    *this = nueva;
}